

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

MessageType __thiscall
cmMakefile::ExpandVariablesInStringNew
          (cmMakefile *this,string *errorstr,string *source,bool escapeQuotes,bool noEscapes,
          bool atOnly,char *filename,long line,bool replaceAt)

{
  char cVar1;
  bool bVar2;
  undefined8 uVar3;
  __type _Var4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  cmake *this_00;
  cmState *this_01;
  reference pvVar8;
  long lVar9;
  size_type sVar10;
  char *pcVar11;
  size_t sVar12;
  ulong uVar13;
  ostream *poVar14;
  string local_628 [32];
  undefined1 local_608 [8];
  ostringstream emsg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  string local_430;
  string *local_410;
  string *def;
  undefined1 local_3e8 [8];
  string varresult_1;
  undefined1 local_3c0 [8];
  string variable;
  char *nextAt;
  char nextc_1;
  char *next_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  char local_319;
  char *pcStack_318;
  char nextc;
  char *start;
  char *next;
  t_lookup lookup_1;
  string local_2f0;
  string local_2d0;
  string local_2b0 [32];
  ostringstream local_290 [8];
  ostringstream ostr;
  undefined1 local_118 [8];
  string svalue;
  string varresult;
  char *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  string *lookup;
  t_lookup var;
  char inc;
  cmState *state;
  MessageType mtype;
  bool done;
  bool error;
  vector<t_lookup,_std::allocator<t_lookup>_> openstack;
  string local_58 [8];
  string result;
  char *last;
  char *in;
  bool replaceAt_local;
  bool atOnly_local;
  bool noEscapes_local;
  bool escapeQuotes_local;
  string *source_local;
  string *errorstr_local;
  cmMakefile *this_local;
  
  last = (char *)std::__cxx11::string::c_str();
  result.field_2._8_8_ = last;
  std::__cxx11::string::string(local_58);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)local_58);
  std::vector<t_lookup,_std::allocator<t_lookup>_>::vector
            ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype);
  bVar2 = false;
  bVar6 = false;
  state._0_4_ = LOG;
  this_00 = GetCMakeInstance(this);
  this_01 = cmake::GetState(this_00);
  if ((ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
       ::lineVar_abi_cxx11_ == '\0') &&
     (iVar7 = __cxa_guard_acquire(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                                   ::lineVar_abi_cxx11_), iVar7 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                ::lineVar_abi_cxx11_,"CMAKE_CURRENT_LIST_LINE",
               (allocator<char> *)((long)&var.loc + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&var.loc + 7));
    __cxa_atexit(std::__cxx11::string::~string,
                 &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                  ::lineVar_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                         ::lineVar_abi_cxx11_);
  }
  do {
    var.loc._6_1_ = *last;
    if (var.loc._6_1_ == '\0') {
      bVar6 = true;
    }
    else if (var.loc._6_1_ == '\n') {
      line = line + 1;
    }
    else if (var.loc._6_1_ == '$') {
      if (atOnly) {
LAB_001ef22a:
        if (!noEscapes) {
          cVar1 = last[1];
          if (cVar1 == 't') {
            std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
            std::__cxx11::string::append((char *)local_58);
            result.field_2._8_8_ = last + 2;
          }
          else if (cVar1 == 'n') {
            std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
            std::__cxx11::string::append((char *)local_58);
            result.field_2._8_8_ = last + 2;
          }
          else if (cVar1 == 'r') {
            std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
            std::__cxx11::string::append((char *)local_58);
            result.field_2._8_8_ = last + 2;
          }
          else if ((cVar1 != ';') ||
                  (bVar5 = std::vector<t_lookup,_std::allocator<t_lookup>_>::empty
                                     ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype), !bVar5
                  )) {
            iVar7 = isalnum((int)cVar1);
            if ((iVar7 == 0) && (cVar1 != '\0')) {
              std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
              result.field_2._8_8_ = last + 1;
            }
            else {
              std::__cxx11::string::operator+=((string *)errorstr,"Invalid character escape \'\\");
              if (cVar1 == '\0') {
                std::__cxx11::string::operator+=((string *)errorstr,"\' (at end of input).");
              }
              else {
                std::__cxx11::string::operator+=((string *)errorstr,cVar1);
                std::__cxx11::string::operator+=((string *)errorstr,"\'.");
              }
              bVar2 = true;
            }
          }
          if (*(char *)result.field_2._8_8_ != '\0') {
            last = last + 1;
          }
        }
      }
      else {
        t_lookup::t_lookup((t_lookup *)&next);
        start = last + 1;
        pcStack_318 = (char *)0x0;
        local_319 = *start;
        if (local_319 == '{') {
          pcStack_318 = last + 2;
          next._0_4_ = 0;
        }
        else if (local_319 != '<') {
          if (local_319 == '\0') {
            std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
            result.field_2._8_8_ = start;
          }
          else {
            bVar5 = cmHasLiteralPrefix<char_const*,5ul>(&start,(char (*) [5])"ENV{");
            if (bVar5) {
              pcStack_318 = last + 5;
              next._0_4_ = 1;
            }
            else {
              bVar5 = cmHasLiteralPrefix<char_const*,7ul>(&start,(char (*) [7])"CACHE{");
              if (bVar5) {
                pcStack_318 = last + 7;
                next._0_4_ = 2;
              }
              else {
                bVar5 = cmsys::RegularExpression::find(&this->cmNamedCurly,start);
                pcVar11 = start;
                if (bVar5) {
                  sVar10 = cmsys::RegularExpression::end(&this->cmNamedCurly);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_380,pcVar11,sVar10,(allocator *)((long)&next_1 + 7));
                  std::operator+(&local_360,"Syntax $",&local_380);
                  std::operator+(&local_340,&local_360,
                                 "{} is not supported.  Only ${}, $ENV{}, and $CACHE{} are allowed."
                                );
                  std::__cxx11::string::operator=((string *)errorstr,(string *)&local_340);
                  std::__cxx11::string::~string((string *)&local_340);
                  std::__cxx11::string::~string((string *)&local_360);
                  std::__cxx11::string::~string((string *)&local_380);
                  std::allocator<char>::~allocator((allocator<char> *)((long)&next_1 + 7));
                  state._0_4_ = FATAL_ERROR;
                  bVar2 = true;
                }
              }
            }
          }
        }
        if (pcStack_318 != (char *)0x0) {
          std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
          result.field_2._8_8_ = pcStack_318;
          last = pcStack_318 + -1;
          lookup_1._0_8_ = std::__cxx11::string::size();
          std::vector<t_lookup,_std::allocator<t_lookup>_>::push_back
                    ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype,(value_type *)&next);
        }
      }
    }
    else if (var.loc._6_1_ == '@') {
      if ((((replaceAt) &&
           (pcVar11 = strchr(last + 1,0x40), variable.field_2._8_8_ = pcVar11,
           pcVar11 != (char *)0x0)) && (pcVar11 != last + 1)) &&
         (sVar12 = strspn(last + 1,
                          "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789/_.+-"),
         pcVar11 == last + sVar12 + 1)) {
        uVar13 = ~(ulong)last + variable.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_3c0,last + 1,uVar13,
                   (allocator *)(varresult_1.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator
                  ((allocator<char> *)(varresult_1.field_2._M_local_buf + 0xf));
        std::__cxx11::string::string((string *)local_3e8);
        if ((filename == (char *)0x0) ||
           (_Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_3c0,
                                    &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                                     ::lineVar_abi_cxx11_), !_Var4)) {
          local_410 = GetDef(this,(string *)local_3c0);
          if (local_410 == (string *)0x0) {
            if ((this->SuppressSideEffects & 1U) == 0) {
              MaybeWarnUninitialized(this,(string *)local_3c0,filename);
            }
          }
          else {
            std::__cxx11::string::operator=((string *)local_3e8,(string *)local_410);
          }
        }
        else {
          std::__cxx11::to_string((string *)&def,line);
          std::__cxx11::string::operator=((string *)local_3e8,(string *)&def);
          std::__cxx11::string::~string((string *)&def);
        }
        if (escapeQuotes) {
          cmSystemTools::EscapeQuotes(&local_430,(string *)local_3e8);
          std::__cxx11::string::operator=((string *)local_3e8,(string *)&local_430);
          std::__cxx11::string::~string((string *)&local_430);
        }
        std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
        std::__cxx11::string::append(local_58);
        last = (char *)variable.field_2._8_8_;
        result.field_2._8_8_ = variable.field_2._8_8_ + 1;
        std::__cxx11::string::~string((string *)local_3e8);
        std::__cxx11::string::~string((string *)local_3c0);
      }
      else {
LAB_001ef6e0:
        bVar5 = std::vector<t_lookup,_std::allocator<t_lookup>_>::empty
                          ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype);
        if ((((!bVar5) && (iVar7 = isalnum((int)var.loc._6_1_), iVar7 == 0)) &&
            (var.loc._6_1_ != '_')) &&
           (((var.loc._6_1_ != '/' && (var.loc._6_1_ != '.')) &&
            ((var.loc._6_1_ != '+' && (var.loc._6_1_ != '-')))))) {
          std::__cxx11::string::operator+=((string *)errorstr,"Invalid character (\'");
          std::__cxx11::string::operator+=((string *)errorstr,var.loc._6_1_);
          std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
          std::vector<t_lookup,_std::allocator<t_lookup>_>::back
                    ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype);
          std::__cxx11::string::substr((ulong)&local_490,(ulong)local_58);
          std::operator+(&local_470,"\') in a variable name: \'",&local_490);
          std::operator+(&local_450,&local_470,"\'");
          std::__cxx11::string::operator+=((string *)errorstr,(string *)&local_450);
          std::__cxx11::string::~string((string *)&local_450);
          std::__cxx11::string::~string((string *)&local_470);
          std::__cxx11::string::~string((string *)&local_490);
          state._0_4_ = FATAL_ERROR;
          bVar2 = true;
        }
      }
    }
    else {
      if (var.loc._6_1_ == '\\') goto LAB_001ef22a;
      if (var.loc._6_1_ != '}') goto LAB_001ef6e0;
      bVar5 = std::vector<t_lookup,_std::allocator<t_lookup>_>::empty
                        ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype);
      if (!bVar5) {
        pvVar8 = std::vector<t_lookup,_std::allocator<t_lookup>_>::back
                           ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype);
        lookup = *(string **)pvVar8;
        var._0_8_ = pvVar8->loc;
        std::vector<t_lookup,_std::allocator<t_lookup>_>::pop_back
                  ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype);
        std::__cxx11::string::append((char *)local_58,result.field_2._8_8_);
        std::__cxx11::string::substr((ulong)&value,(ulong)local_58);
        local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value;
        varresult.field_2._8_8_ = 0;
        std::__cxx11::string::string((string *)(svalue.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)local_118);
        if ((int)lookup == 0) {
          if ((filename == (char *)0x0) ||
             (_Var4 = std::operator==(local_b0,&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool)
                                                ::lineVar_abi_cxx11_), !_Var4)) {
            varresult.field_2._8_8_ = GetDefinition(this,local_b0);
          }
          else {
            std::__cxx11::ostringstream::ostringstream(local_290);
            std::ostream::operator<<(local_290,line);
            std::__cxx11::ostringstream::str();
            std::__cxx11::string::operator=((string *)(svalue.field_2._M_local_buf + 8),local_2b0);
            std::__cxx11::string::~string(local_2b0);
            std::__cxx11::ostringstream::~ostringstream(local_290);
          }
        }
        else if ((int)lookup == 1) {
          bVar5 = cmsys::SystemTools::GetEnv(local_b0,(string *)local_118);
          if (bVar5) {
            varresult.field_2._8_8_ = std::__cxx11::string::c_str();
          }
        }
        else if ((int)lookup == 2) {
          varresult.field_2._8_8_ = cmState::GetCacheEntryValue(this_01,local_b0);
        }
        if (varresult.field_2._8_8_ == 0) {
          if ((this->SuppressSideEffects & 1U) == 0) {
            MaybeWarnUninitialized(this,local_b0,filename);
          }
        }
        else if (escapeQuotes) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2f0,(char *)varresult.field_2._8_8_,
                     (allocator<char> *)((long)&lookup_1.loc + 7));
          cmSystemTools::EscapeQuotes(&local_2d0,&local_2f0);
          std::__cxx11::string::operator=
                    ((string *)(svalue.field_2._M_local_buf + 8),(string *)&local_2d0);
          std::__cxx11::string::~string((string *)&local_2d0);
          std::__cxx11::string::~string((string *)&local_2f0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&lookup_1.loc + 7));
        }
        else {
          std::__cxx11::string::operator=
                    ((string *)(svalue.field_2._M_local_buf + 8),(char *)varresult.field_2._8_8_);
        }
        uVar3 = var._0_8_;
        lVar9 = std::__cxx11::string::size();
        std::__cxx11::string::replace((ulong)local_58,uVar3,(string *)(lVar9 - var._0_8_));
        result.field_2._8_8_ = last + 1;
        std::__cxx11::string::~string((string *)local_118);
        std::__cxx11::string::~string((string *)(svalue.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)&value);
      }
    }
    bVar5 = false;
    if ((!bVar2) && (bVar5 = false, !bVar6)) {
      bVar5 = last[1] != '\0';
      last = last + 1;
    }
    if (!bVar5) {
      if ((!bVar2) &&
         (bVar6 = std::vector<t_lookup,_std::allocator<t_lookup>_>::empty
                            ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype), !bVar6)) {
        std::__cxx11::string::operator+=
                  ((string *)errorstr,"There is an unterminated variable reference.");
        bVar2 = true;
      }
      if (bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_608);
        std::operator<<((ostream *)local_608,"Syntax error in cmake code ");
        if (filename != (char *)0x0) {
          poVar14 = std::operator<<((ostream *)local_608,"at\n");
          poVar14 = std::operator<<(poVar14,"  ");
          poVar14 = std::operator<<(poVar14,filename);
          poVar14 = std::operator<<(poVar14,":");
          poVar14 = (ostream *)std::ostream::operator<<(poVar14,line);
          std::operator<<(poVar14,"\n");
        }
        poVar14 = std::operator<<((ostream *)local_608,"when parsing string\n");
        poVar14 = std::operator<<(poVar14,"  ");
        poVar14 = std::operator<<(poVar14,(string *)source);
        std::operator<<(poVar14,"\n");
        std::operator<<((ostream *)local_608,(string *)errorstr);
        state._0_4_ = FATAL_ERROR;
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=((string *)errorstr,local_628);
        std::__cxx11::string::~string(local_628);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_608);
      }
      else {
        std::__cxx11::string::append((char *)local_58);
        std::__cxx11::string::operator=((string *)source,local_58);
      }
      std::vector<t_lookup,_std::allocator<t_lookup>_>::~vector
                ((vector<t_lookup,_std::allocator<t_lookup>_> *)&mtype);
      std::__cxx11::string::~string(local_58);
      return (MessageType)state;
    }
  } while( true );
}

Assistant:

MessageType cmMakefile::ExpandVariablesInStringNew(
  std::string& errorstr, std::string& source, bool escapeQuotes,
  bool noEscapes, bool atOnly, const char* filename, long line,
  bool replaceAt) const
{
  // This method replaces ${VAR} and @VAR@ where VAR is looked up
  // with GetDefinition(), if not found in the map, nothing is expanded.
  // It also supports the $ENV{VAR} syntax where VAR is looked up in
  // the current environment variables.

  const char* in = source.c_str();
  const char* last = in;
  std::string result;
  result.reserve(source.size());
  std::vector<t_lookup> openstack;
  bool error = false;
  bool done = false;
  MessageType mtype = MessageType::LOG;

  cmState* state = this->GetCMakeInstance()->GetState();

  static const std::string lineVar = "CMAKE_CURRENT_LIST_LINE";
  do {
    char inc = *in;
    switch (inc) {
      case '}':
        if (!openstack.empty()) {
          t_lookup var = openstack.back();
          openstack.pop_back();
          result.append(last, in - last);
          std::string const& lookup = result.substr(var.loc);
          const char* value = nullptr;
          std::string varresult;
          std::string svalue;
          switch (var.domain) {
            case NORMAL:
              if (filename && lookup == lineVar) {
                std::ostringstream ostr;
                ostr << line;
                varresult = ostr.str();
              } else {
                value = this->GetDefinition(lookup);
              }
              break;
            case ENVIRONMENT:
              if (cmSystemTools::GetEnv(lookup, svalue)) {
                value = svalue.c_str();
              }
              break;
            case CACHE:
              value = state->GetCacheEntryValue(lookup);
              break;
          }
          // Get the string we're meant to append to.
          if (value) {
            if (escapeQuotes) {
              varresult = cmSystemTools::EscapeQuotes(value);
            } else {
              varresult = value;
            }
          } else if (!this->SuppressSideEffects) {
            this->MaybeWarnUninitialized(lookup, filename);
          }
          result.replace(var.loc, result.size() - var.loc, varresult);
          // Start looking from here on out.
          last = in + 1;
        }
        break;
      case '$':
        if (!atOnly) {
          t_lookup lookup;
          const char* next = in + 1;
          const char* start = nullptr;
          char nextc = *next;
          if (nextc == '{') {
            // Looking for a variable.
            start = in + 2;
            lookup.domain = NORMAL;
          } else if (nextc == '<') {
          } else if (!nextc) {
            result.append(last, next - last);
            last = next;
          } else if (cmHasLiteralPrefix(next, "ENV{")) {
            // Looking for an environment variable.
            start = in + 5;
            lookup.domain = ENVIRONMENT;
          } else if (cmHasLiteralPrefix(next, "CACHE{")) {
            // Looking for a cache variable.
            start = in + 7;
            lookup.domain = CACHE;
          } else {
            if (this->cmNamedCurly.find(next)) {
              errorstr = "Syntax $" +
                std::string(next, this->cmNamedCurly.end()) +
                "{} is not supported.  Only ${}, $ENV{}, "
                "and $CACHE{} are allowed.";
              mtype = MessageType::FATAL_ERROR;
              error = true;
            }
          }
          if (start) {
            result.append(last, in - last);
            last = start;
            in = start - 1;
            lookup.loc = result.size();
            openstack.push_back(lookup);
          }
          break;
        }
        CM_FALLTHROUGH;
      case '\\':
        if (!noEscapes) {
          const char* next = in + 1;
          char nextc = *next;
          if (nextc == 't') {
            result.append(last, in - last);
            result.append("\t");
            last = next + 1;
          } else if (nextc == 'n') {
            result.append(last, in - last);
            result.append("\n");
            last = next + 1;
          } else if (nextc == 'r') {
            result.append(last, in - last);
            result.append("\r");
            last = next + 1;
          } else if (nextc == ';' && openstack.empty()) {
            // Handled in ExpandListArgument; pass the backslash literally.
          } else if (isalnum(nextc) || nextc == '\0') {
            errorstr += "Invalid character escape '\\";
            if (nextc) {
              errorstr += nextc;
              errorstr += "'.";
            } else {
              errorstr += "' (at end of input).";
            }
            error = true;
          } else {
            // Take what we've found so far, skipping the escape character.
            result.append(last, in - last);
            // Start tracking from the next character.
            last = in + 1;
          }
          // Skip the next character since it was escaped, but don't read past
          // the end of the string.
          if (*last) {
            ++in;
          }
        }
        break;
      case '\n':
        // Onto the next line.
        ++line;
        break;
      case '\0':
        done = true;
        break;
      case '@':
        if (replaceAt) {
          const char* nextAt = strchr(in + 1, '@');
          if (nextAt && nextAt != in + 1 &&
              nextAt ==
                in + 1 +
                  strspn(in + 1,
                         "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                         "abcdefghijklmnopqrstuvwxyz"
                         "0123456789/_.+-")) {
            std::string variable(in + 1, nextAt - in - 1);

            std::string varresult;
            if (filename && variable == lineVar) {
              varresult = std::to_string(line);
            } else {
              const std::string* def = this->GetDef(variable);
              if (def) {
                varresult = *def;
              } else if (!this->SuppressSideEffects) {
                this->MaybeWarnUninitialized(variable, filename);
              }
            }

            if (escapeQuotes) {
              varresult = cmSystemTools::EscapeQuotes(varresult);
            }
            // Skip over the variable.
            result.append(last, in - last);
            result.append(varresult);
            in = nextAt;
            last = in + 1;
            break;
          }
        }
      // Failed to find a valid @ expansion; treat it as literal.
      /* FALLTHROUGH */
      default: {
        if (!openstack.empty() &&
            !(isalnum(inc) || inc == '_' || inc == '/' || inc == '.' ||
              inc == '+' || inc == '-')) {
          errorstr += "Invalid character (\'";
          errorstr += inc;
          result.append(last, in - last);
          errorstr += "\') in a variable name: "
                      "'" +
            result.substr(openstack.back().loc) + "'";
          mtype = MessageType::FATAL_ERROR;
          error = true;
        }
        break;
      }
    }
    // Look at the next character.
  } while (!error && !done && *++in);

  // Check for open variable references yet.
  if (!error && !openstack.empty()) {
    // There's an open variable reference waiting.  Policy CMP0010 flags
    // whether this is an error or not.  The new parser now enforces
    // CMP0010 as well.
    errorstr += "There is an unterminated variable reference.";
    error = true;
  }

  if (error) {
    std::ostringstream emsg;
    emsg << "Syntax error in cmake code ";
    if (filename) {
      // This filename and line number may be more specific than the
      // command context because one command invocation can have
      // arguments on multiple lines.
      emsg << "at\n"
           << "  " << filename << ":" << line << "\n";
    }
    emsg << "when parsing string\n"
         << "  " << source << "\n";
    emsg << errorstr;
    mtype = MessageType::FATAL_ERROR;
    errorstr = emsg.str();
  } else {
    // Append the rest of the unchanged part of the string.
    result.append(last);

    source = result;
  }

  return mtype;
}